

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::~BrokerBase(BrokerBase *this)

{
  BrokerBase *in_RDI;
  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_BrokerBase = (_func_int **)&PTR__BrokerBase_0095ec28;
  if ((in_RDI->queueDisabled & 1U) == 0) {
    joinAllThreads(in_RDI);
  }
  CLI::std::shared_ptr<helics::ProfilerBuffer>::~shared_ptr
            ((shared_ptr<helics::ProfilerBuffer> *)0x46d35c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  CLI::std::shared_ptr<helics::LogManager>::~shared_ptr((shared_ptr<helics::LogManager> *)0x46d38f);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingPriorityQueue
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             in_RDI);
  CLI::std::
  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
  ~unique_ptr(in_stack_fffffffffffffff0);
  std::thread::~thread((thread *)0x46d3c2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

BrokerBase::~BrokerBase()
{
    if (!queueDisabled) {
        try {
            joinAllThreads();
        }
        catch (...) {
            ;  // no exceptions in the destructor
        }
    }
}